

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void exception_handler(int sig)

{
  char *pcVar1;
  uint in_EDI;
  char *sig_strerror;
  
  pcVar1 = strsignal(in_EDI);
  cm_print_error("Test failed with exception: %s(%d)",pcVar1,(ulong)in_EDI);
  exit_test((int)((ulong)pcVar1 >> 0x20));
  return;
}

Assistant:

static void exception_handler(int sig) {
    const char *sig_strerror = "";

#ifdef HAVE_STRSIGNAL
    sig_strerror = strsignal(sig);
#endif

    cm_print_error("Test failed with exception: %s(%d)",
                   sig_strerror, sig);
    exit_test(1);
}